

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mp_math.c
# Opt level: O2

int mp_read_radix(mp_int *a,char *str,int radix)

{
  char cVar1;
  int iVar2;
  __int32_t **pp_Var3;
  char cVar4;
  ulong uVar5;
  char *pcVar6;
  
  mp_zero(a);
  if (radix - 0x41U < 0xffffffc1) {
    iVar2 = -3;
  }
  else {
    cVar1 = *str;
    pcVar6 = str + (cVar1 == '-');
    mp_zero(a);
    do {
      cVar4 = *pcVar6;
      if ((long)cVar4 == 0) {
LAB_0010751c:
        if (a->used == 0) {
          return 0;
        }
        a->sign = (uint)(cVar1 == '-');
        return 0;
      }
      if ((uint)radix < 0x24) {
        pp_Var3 = __ctype_toupper_loc();
        cVar4 = (char)(*pp_Var3)[cVar4];
      }
      for (uVar5 = 0; uVar5 != 0x40; uVar5 = uVar5 + 1) {
        if (cVar4 == mp_s_rmap[uVar5]) goto LAB_001074ee;
      }
      uVar5 = 0x40;
LAB_001074ee:
      if (radix <= (int)uVar5) goto LAB_0010751c;
      iVar2 = mp_mul_d(a,(ulong)(uint)radix,a);
      if (iVar2 != 0) {
        return iVar2;
      }
      iVar2 = mp_add_d(a,uVar5 & 0xffffffff,a);
      pcVar6 = pcVar6 + 1;
    } while (iVar2 == 0);
  }
  return iVar2;
}

Assistant:

int mp_read_radix (mp_int * a, const char *str, int radix)
{
  int     y, res, neg;
  char    ch;

  /* zero the digit bignum */
  mp_zero(a);

  /* make sure the radix is ok */
  if (radix < 2 || radix > 64) {
    return MP_VAL;
  }

  /* if the leading digit is a 
   * minus set the sign to negative. 
   */
  if (*str == '-') {
    ++str;
    neg = MP_NEG;
  } else {
    neg = MP_ZPOS;
  }

  /* set the integer to the default of zero */
  mp_zero (a);
  
  /* process each digit of the string */
  while (*str) {
    /* if the radix < 36 the conversion is case insensitive
     * this allows numbers like 1AB and 1ab to represent the same  value
     * [e.g. in hex]
     */
    ch = (char) ((radix < 36) ? toupper (*str) : *str);
    for (y = 0; y < 64; y++) {
      if (ch == mp_s_rmap[y]) {
         break;
      }
    }

    /* if the char was found in the map 
     * and is less than the given radix add it
     * to the number, otherwise exit the loop. 
     */
    if (y < radix) {
      if ((res = mp_mul_d (a, (mp_digit) radix, a)) != MP_OKAY) {
         return res;
      }
      if ((res = mp_add_d (a, (mp_digit) y, a)) != MP_OKAY) {
         return res;
      }
    } else {
      break;
    }
    ++str;
  }
  
  /* set the sign only if a != 0 */
  if (mp_iszero(a) != 1) {
     a->sign = neg;
  }
  return MP_OKAY;
}